

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denoise.c
# Opt level: O2

void compute_band_corr(float *bandE,kiss_fft_cpx *X,kiss_fft_cpx *P)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float local_68 [4];
  float sum [22];
  
  sum[0xc] = 0.0;
  sum[0xd] = 0.0;
  sum[0xe] = 0.0;
  sum[0xf] = 0.0;
  sum[8] = 0.0;
  sum[9] = 0.0;
  sum[10] = 0.0;
  sum[0xb] = 0.0;
  sum[4] = 0.0;
  sum[5] = 0.0;
  sum[6] = 0.0;
  sum[7] = 0.0;
  sum[0x10] = 0.0;
  sum[0x11] = 0.0;
  sum[0] = 0.0;
  sum[1] = 0.0;
  sum[2] = 0.0;
  sum[3] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  lVar2 = 0;
  while (lVar4 = lVar2, lVar4 != 0x15) {
    iVar5 = (int)eband5ms[lVar4 + 1] - (int)eband5ms[lVar4];
    uVar6 = iVar5 * 4;
    uVar1 = uVar6;
    if (iVar5 * 4 < 1) {
      uVar1 = 0;
    }
    lVar3 = (long)((int)eband5ms[lVar4] << 2);
    for (uVar7 = 0; lVar2 = lVar4 + 1, uVar1 != uVar7; uVar7 = uVar7 + 1) {
      fVar8 = (float)(int)uVar7 / (float)(int)uVar6;
      fVar9 = X[lVar3 + uVar7].i * P[lVar3 + uVar7].i + X[lVar3 + uVar7].r * P[lVar3 + uVar7].r;
      *(ulong *)(local_68 + lVar4) =
           CONCAT44(fVar9 * fVar8 + (float)((ulong)*(undefined8 *)(local_68 + lVar4) >> 0x20),
                    fVar9 * (1.0 - fVar8) + (float)*(undefined8 *)(local_68 + lVar4));
    }
  }
  local_68[0] = local_68[0] + local_68[0];
  sum[0x11] = sum[0x11] + sum[0x11];
  for (lVar2 = 0; lVar2 != 0x16; lVar2 = lVar2 + 1) {
    bandE[lVar2] = local_68[lVar2];
  }
  return;
}

Assistant:

void compute_band_corr(float *bandE, const kiss_fft_cpx *X, const kiss_fft_cpx *P) {
    int i;
    float sum[NB_BANDS] = {0};
    for (i = 0; i < NB_BANDS - 1; i++) {
        int j;
        int band_size;
        band_size = (eband5ms[i + 1] - eband5ms[i]) << FRAME_SIZE_SHIFT;
        for (j = 0; j < band_size; j++) {
            float tmp;
            float frac = (float) j / band_size;
            tmp = X[(eband5ms[i] << FRAME_SIZE_SHIFT) + j].r * P[(eband5ms[i] << FRAME_SIZE_SHIFT) + j].r;
            tmp += X[(eband5ms[i] << FRAME_SIZE_SHIFT) + j].i * P[(eband5ms[i] << FRAME_SIZE_SHIFT) + j].i;
            sum[i] += (1 - frac) * tmp;
            sum[i + 1] += frac * tmp;
        }
    }
    sum[0] *= 2;
    sum[NB_BANDS - 1] *= 2;
    for (i = 0; i < NB_BANDS; i++) {
        bandE[i] = sum[i];
    }
}